

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O2

void __thiscall QRingBuffer::append(QRingBuffer *this,QByteArray *qba)

{
  iterator iVar1;
  long in_FS_OFFSET;
  QRingChunk QStack_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->bufferSize == 0) && ((this->buffers).d.size != 0)) {
    iVar1 = QList<QRingChunk>::end(&this->buffers);
    QRingChunk::assign(iVar1.i + -1,qba);
  }
  else {
    QRingChunk::QRingChunk(&QStack_48,qba);
    QList<QRingChunk>::emplaceBack<QRingChunk>(&this->buffers,&QStack_48);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&QStack_48);
  }
  this->bufferSize = this->bufferSize + (qba->d).size;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRingBuffer::append(const QByteArray &qba)
{
    if (bufferSize != 0 || buffers.isEmpty())
        buffers.append(QRingChunk(qba));
    else
        buffers.last().assign(qba);
    bufferSize += qba.size();
}